

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O3

int musig_vectors_keyagg_and_tweak
              (MUSIG_ERROR *error,secp256k1_musig_keyagg_cache *keyagg_cache,uchar *agg_pk_ser,
              uchar (*pubkeys33) [33],uchar (*tweaks32) [32],size_t key_indices_len,
              size_t *key_indices,size_t tweak_indices_len,size_t *tweak_indices,int *is_xonly)

{
  int iVar1;
  MUSIG_ERROR MVar2;
  secp256k1_pubkey *pubkey;
  ulong uVar3;
  secp256k1_pubkey *pk_ptr [7];
  secp256k1_xonly_pubkey agg_pk_xonly;
  secp256k1_pubkey agg_pk;
  secp256k1_pubkey pubkeys [7];
  secp256k1_pubkey *local_2b8 [8];
  secp256k1_xonly_pubkey local_278;
  secp256k1_pubkey local_238;
  secp256k1_pubkey local_1f8 [7];
  
  if (0 < (int)(uint)key_indices_len) {
    pubkey = local_1f8;
    MVar2 = MUSIG_PUBKEY;
    uVar3 = 0;
    do {
      iVar1 = secp256k1_ec_pubkey_parse(CTX,pubkey,pubkeys33[key_indices[uVar3]],0x21);
      if (iVar1 == 0) goto LAB_0012a893;
      local_2b8[uVar3] = pubkey;
      uVar3 = uVar3 + 1;
      pubkey = pubkey + 1;
    } while (((uint)key_indices_len & 0x7fffffff) != uVar3);
  }
  iVar1 = secp256k1_musig_pubkey_agg
                    (CTX,(secp256k1_xonly_pubkey *)0x0,keyagg_cache,local_2b8,key_indices_len);
  if (iVar1 != 0) {
    if (0 < (int)(uint)tweak_indices_len) {
      uVar3 = 0;
      do {
        if (is_xonly[uVar3] == 0) {
          iVar1 = secp256k1_musig_pubkey_tweak_add_internal
                            (CTX,(secp256k1_pubkey *)0x0,keyagg_cache,tweaks32[tweak_indices[uVar3]]
                             ,0);
          if (iVar1 == 0) {
            MVar2 = MUSIG_TWEAK;
            goto LAB_0012a893;
          }
        }
        else {
          MVar2 = MUSIG_TWEAK;
          iVar1 = secp256k1_musig_pubkey_tweak_add_internal
                            (CTX,(secp256k1_pubkey *)0x0,keyagg_cache,tweaks32[tweak_indices[uVar3]]
                             ,1);
          if (iVar1 == 0) goto LAB_0012a893;
        }
        uVar3 = uVar3 + 1;
      } while (((uint)tweak_indices_len & 0x7fffffff) != uVar3);
    }
    iVar1 = secp256k1_musig_pubkey_get(CTX,&local_238,keyagg_cache);
    if ((iVar1 != 0) &&
       (iVar1 = secp256k1_xonly_pubkey_from_pubkey(CTX,&local_278,(int *)0x0,&local_238), iVar1 != 0
       )) {
      if (agg_pk_ser == (uchar *)0x0) {
        return 1;
      }
      iVar1 = secp256k1_xonly_pubkey_serialize(CTX,agg_pk_ser,&local_278);
      MVar2 = MUSIG_OTHER;
      if (iVar1 != 0) {
        return 1;
      }
      goto LAB_0012a893;
    }
  }
  MVar2 = MUSIG_OTHER;
LAB_0012a893:
  *error = MVar2;
  return 0;
}

Assistant:

int musig_vectors_keyagg_and_tweak(enum MUSIG_ERROR *error,
                                   secp256k1_musig_keyagg_cache *keyagg_cache,
                                   unsigned char *agg_pk_ser,
                                   const unsigned char pubkeys33[][33],
                                   const unsigned char tweaks32[][32],
                                   size_t key_indices_len,
                                   const size_t *key_indices,
                                   size_t tweak_indices_len,
                                   const size_t *tweak_indices,
                                   const int *is_xonly) {
    secp256k1_pubkey pubkeys[MUSIG_VECTORS_MAX_PUBKEYS];
    const secp256k1_pubkey *pk_ptr[MUSIG_VECTORS_MAX_PUBKEYS];
    int i;
    secp256k1_pubkey agg_pk;
    secp256k1_xonly_pubkey agg_pk_xonly;

    for (i = 0; i < (int)key_indices_len; i++) {
        if (!secp256k1_ec_pubkey_parse(CTX, &pubkeys[i], pubkeys33[key_indices[i]], 33)) {
            *error = MUSIG_PUBKEY;
            return 0;
        }
        pk_ptr[i] = &pubkeys[i];
    }
    if (!secp256k1_musig_pubkey_agg(CTX, NULL, keyagg_cache, pk_ptr, key_indices_len)) {
        *error = MUSIG_OTHER;
        return 0;
    }

    for (i = 0; i < (int)tweak_indices_len; i++) {
        if (is_xonly[i]) {
            if (!secp256k1_musig_pubkey_xonly_tweak_add(CTX, NULL, keyagg_cache, tweaks32[tweak_indices[i]])) {
                *error = MUSIG_TWEAK;
                return 0;
            }
        } else {
            if (!secp256k1_musig_pubkey_ec_tweak_add(CTX, NULL, keyagg_cache, tweaks32[tweak_indices[i]])) {
                *error = MUSIG_TWEAK;
                return 0;
            }
        }
    }
    if (!secp256k1_musig_pubkey_get(CTX, &agg_pk, keyagg_cache)) {
        *error = MUSIG_OTHER;
        return 0;
    }

    if (!secp256k1_xonly_pubkey_from_pubkey(CTX, &agg_pk_xonly, NULL, &agg_pk)) {
        *error = MUSIG_OTHER;
        return 0;
    }

    if (agg_pk_ser != NULL) {
        if (!secp256k1_xonly_pubkey_serialize(CTX, agg_pk_ser, &agg_pk_xonly)) {
            *error = MUSIG_OTHER;
            return 0;
        }
    }

    return 1;
}